

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O2

CppLogger * __thiscall
CppLogger::CppLogger::printFormat(CppLogger *this,Level t_Level,string *t_Message)

{
  size_type *psVar1;
  CppLogger *pCVar2;
  ostream *poVar3;
  tm *__tp;
  string *in_RCX;
  uint uVar4;
  FormatAttribute *attribute;
  pointer pFVar5;
  undefined4 in_register_00000034;
  char *pcVar6;
  vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> format;
  time_t currTime;
  char time [100];
  
  uVar4 = (int)t_Message - 1;
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::vector
            (&format,(vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                      *)(CONCAT44(in_register_00000034,t_Level) + (long)(int)uVar4 * 0x18 + 0x28));
  std::__cxx11::stringstream::stringstream((stringstream *)this);
  psVar1 = &(this->m_Name)._M_string_length;
  pFVar5 = format.
           super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pFVar5 == format.
                  super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::_Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
      ~_Vector_base(&format.
                     super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                   );
      return this;
    }
    switch(*pFVar5) {
    case Name:
      poVar3 = std::operator<<((ostream *)psVar1,"[");
      poVar3 = std::operator<<(poVar3,(string *)(CONCAT44(in_register_00000034,t_Level) + 8));
      pcVar6 = "] ";
      goto LAB_00103b3b;
    case Time:
      ::time(&currTime);
      __tp = localtime(&currTime);
      strftime(time,0x32,"%T",__tp);
      poVar3 = std::operator<<((ostream *)psVar1,time);
      std::operator<<(poVar3," ");
      break;
    case Level:
      if (uVar4 < 5) {
        pCVar2 = (CppLogger *)
                 (*(code *)(&DAT_00105010 + *(int *)(&DAT_00105010 + (ulong)uVar4 * 4)))();
        return pCVar2;
      }
      break;
    case Message:
      poVar3 = std::operator<<((ostream *)psVar1,in_RCX);
      pcVar6 = " ";
LAB_00103b3b:
      std::operator<<(poVar3,pcVar6);
    }
    pFVar5 = pFVar5 + 1;
  } while( true );
}

Assistant:

std::stringstream CppLogger::printFormat(Level t_Level, std::string t_Message) {
        std::vector<FormatAttribute > format = m_Format[t_Level - 1].getFormat();
        std::stringstream sstr;
        for (const auto &attribute : format) {
            switch (attribute) {
                case FormatAttribute::None:
                    break;
                case FormatAttribute::Name:
                    sstr << "[" << m_Name << "] ";
                    break;
                case FormatAttribute::Time: {
                    std::time_t currTime;
                    std::tm * currTm;
                    std::time(&currTime);
                    currTm = std::localtime(&currTime);

                    char time[100];
                    std::strftime(time, 50, "%T", currTm);
                    sstr << time << " ";
                    break;
                }
                case FormatAttribute::Level: {
                    switch (t_Level) {
                        case None:
                            break;
                        case Trace:
                            sstr << "(Trace) ";
                            break;
                        case Info:
                            sstr << "(Info) ";
                            break;
                        case Warn:
                            sstr << "(Warn) ";
                            break;
                        case Error:
                            sstr << "(Error) ";
                            break;
                        case FatalError:
                            sstr << "(Fatal Error) ";
                            break;
                    }
                    break;
                }
                case FormatAttribute::Message:
                    sstr << t_Message << " ";
                    break;
            }
        }
        return sstr;
    }